

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
          (ColorBlendState *this,deUint32 _attachmentCount,
          VkPipelineColorBlendAttachmentState *_attachments,VkBool32 _logicOpEnable,
          VkLogicOp _logicOp)

{
  pointer pVVar1;
  allocator_type local_19;
  
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&this->m_attachments,_attachments,_attachments + _attachmentCount,&local_19);
  (this->super_VkPipelineColorBlendStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  (this->super_VkPipelineColorBlendStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineColorBlendStateCreateInfo).flags = 0;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable = _logicOpEnable;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOp = _logicOp;
  pVVar1 = (this->m_attachments).
           super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineColorBlendStateCreateInfo).attachmentCount =
       (deUint32)
       ((ulong)((long)(this->m_attachments).
                      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 5);
  (this->super_VkPipelineColorBlendStateCreateInfo).pAttachments = pVVar1;
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::ColorBlendState (deUint32											_attachmentCount,
													  const vk::VkPipelineColorBlendAttachmentState*	_attachments,
													  vk::VkBool32										_logicOpEnable,
													  vk::VkLogicOp										_logicOp)
	: m_attachments(_attachments, _attachments + _attachmentCount)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
	pNext	= DE_NULL;
	flags					= 0;
	logicOpEnable			= _logicOpEnable;
	logicOp					= _logicOp;
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachments[0];
}